

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O2

pair<pstore::index::details::index_pointer,_bool> __thiscall
pstore::index::
hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
::insert_node<std::pair<pstore::uint128,pstore::extent<pstore::repo::compilation>>>
          (hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
           *this,transaction_base *transaction,index_pointer node,
          pair<pstore::uint128,_pstore::extent<pstore::repo::compilation>_> *value,hash_type hash,
          uint shifts,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents,
          bool is_upsert)

{
  database *this_00;
  address db;
  key_type *pkVar1;
  index_pointer iVar2;
  index_pointer iVar3;
  address addr;
  ulong extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  pair<pstore::index::details::index_pointer,_bool> pVar4;
  index_pointer node_local;
  index_pointer local_40;
  undefined8 local_38;
  
  node_local = node;
  if (((ulong)node.internal_ & 1) == 0) {
    this_00 = transaction->db_;
    addr.a_ = (value_type)value;
    db = details::index_pointer::to_address((index_pointer *)&node_local.addr_);
    pkVar1 = hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
             ::get_key((key_type *)this,
                       (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                        *)this_00,(database *)db.a_,addr);
    if (pkVar1 == *(key_type **)&(value->first).v_ &&
        *(ulong *)((long)&(value->first).v_ + 8) == extraout_RDX) {
      if (is_upsert) {
        iVar2.addr_ = store_leaf_node<std::pair<pstore::uint128,pstore::extent<pstore::repo::compilation>>>
                                (this,transaction,value,parents);
        pVar4._9_7_ = (int7)((ulong)extraout_RDX_00 >> 8);
        pVar4.second = true;
        pVar4.first.internal_ = iVar2.internal_;
      }
      else {
        local_40 = node_local;
        local_38 = 0xffffffffffffffff;
        array_stack<pstore::index::details::parent_type,_13UL>::push
                  (parents.ptr_,(value_type *)&local_40.addr_);
        pVar4._9_7_ = (int7)((ulong)extraout_RDX_01 >> 8);
        pVar4.second = true;
        pVar4.first.internal_ = node_local.internal_;
      }
    }
    else {
      iVar3 = insert_into_leaf<std::pair<pstore::uint128,pstore::extent<pstore::repo::compilation>>>
                        (this,transaction,&node_local,value,extraout_RDX >> ((byte)shifts & 0x3f),
                         hash,shifts,parents);
      pVar4._8_8_ = 0;
      pVar4.first = iVar3;
    }
  }
  else if (shifts < 0x42) {
    pVar4 = insert_into_internal<std::pair<pstore::uint128,pstore::extent<pstore::repo::compilation>>>
                      (this,transaction,node,value,hash,shifts,parents,is_upsert);
  }
  else {
    pVar4 = insert_into_linear<std::pair<pstore::uint128,pstore::extent<pstore::repo::compilation>>>
                      (this,transaction,node,value,parents,is_upsert);
  }
  return pVar4;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert_node (
            transaction_base & transaction, index_pointer const node, OtherValueType const & value,
            hash_type hash, unsigned shifts, gsl::not_null<parent_stack *> parents, bool is_upsert)
            -> std::pair<index_pointer, bool> {

            index_pointer result;
            bool key_exists = false;
            if (node.is_leaf ()) { // This node is a leaf node.
                key_type const existing_key =
                    get_key (transaction.db (), node.to_address ()); // Read key.
                if (equal_ (value.first, existing_key)) {
                    if (is_upsert) {
                        result = this->store_leaf_node (transaction, value, parents);
                    } else {
                        parents->push (details::parent_type{node});
                        result = node;
                    }
                    key_exists = true;
                } else {
                    auto const existing_hash =
                        static_cast<hash_type> ((hash_ (existing_key) >> shifts));
                    result = this->insert_into_leaf (transaction, node, value, existing_hash, hash,
                                                     shifts, parents);
                }
            } else {
                // This node is an internal or a linear node.
                if (details::depth_is_internal_node (shifts)) {
                    std::tie (result, key_exists) = this->insert_into_internal (
                        transaction, node, value, hash, shifts, parents, is_upsert);
                } else {
                    std::tie (result, key_exists) =
                        this->insert_into_linear (transaction, node, value, parents, is_upsert);
                }
            }

            return std::make_pair (result, key_exists);
        }